

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O1

bool libaom_examples::anon_unknown_0::parse_color_properties
               (ifstream *file,int min_indent,int *line_idx,ColorProperties *color)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *indent_00;
  bool *has_list_prefix_00;
  uint8_t *v;
  byte bVar4;
  bool syntax_error;
  bool has_list_prefix;
  int indent;
  uint8_t *local_88;
  uint8_t *local_80;
  uint8_t *local_78;
  ColorProperties *local_70;
  string field_name;
  ParsedValue value;
  
  indent = -1;
  field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
  field_name._M_string_length = 0;
  field_name.field_2._M_local_buf[0] = '\0';
  value.type_ = kNone;
  value.int_value_ = 0;
  value.double_value_ = 0.0;
  local_80 = &color->color_primaries;
  local_88 = &color->transfer_characteristics;
  local_78 = &color->matrix_coefficients;
  color->color_range = false;
  color->color_primaries = '\0';
  color->transfer_characteristics = '\0';
  color->matrix_coefficients = '\0';
  local_70 = color;
  do {
    while( true ) {
      indent_00 = &indent;
      has_list_prefix_00 = &has_list_prefix;
      bVar1 = parse_line(file,min_indent,false,indent_00,has_list_prefix_00,line_idx,&field_name,
                         &value,&syntax_error);
      iVar3 = (int)indent_00;
      if (!bVar1) {
        bVar4 = syntax_error ^ 1;
        goto LAB_00128571;
      }
      iVar2 = std::__cxx11::string::compare((char *)&field_name);
      if (iVar2 != 0) break;
      bVar1 = ParsedValue::IntegerValueInRange<bool>
                        (&value,(ulong)(uint)*line_idx,(int64_t)local_70,iVar3,has_list_prefix_00);
      if (!bVar1) {
        bVar4 = 0;
        goto LAB_00128571;
      }
    }
    iVar3 = std::__cxx11::string::compare((char *)&field_name);
    if (iVar3 == 0) {
      iVar3 = *line_idx;
      v = local_80;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&field_name);
      if (iVar3 == 0) {
        iVar3 = *line_idx;
        v = local_88;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&field_name);
        if (iVar3 != 0) {
          bVar4 = 0;
          fprintf(_stderr,"Error: Unknown field \'%s\' at line %d\n",field_name._M_dataplus._M_p,
                  (ulong)(uint)*line_idx);
          break;
        }
        iVar3 = *line_idx;
        v = local_78;
      }
    }
    bVar4 = 0;
    bVar1 = ParsedValue::IntegerValueInRange<unsigned_char>(&value,0,0xff,iVar3,v);
  } while (bVar1);
LAB_00128571:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_name._M_dataplus._M_p != &field_name.field_2) {
    operator_delete(field_name._M_dataplus._M_p);
  }
  return (bool)bVar4;
}

Assistant:

bool parse_color_properties(std::ifstream &file, int min_indent, int *line_idx,
                            ColorProperties *color) {
  bool has_list_prefix;
  int indent = -1;
  std::string field_name;
  ParsedValue value;
  bool syntax_error;
  *color = {};
  while (parse_line(file, min_indent, /*is_list=*/false, &indent,
                    &has_list_prefix, line_idx, &field_name, &value,
                    &syntax_error)) {
    if (field_name == "color_range") {
      RETURN_IF_FALSE(value.IntegerValueInRange(/*min=*/0, /*max=*/1, *line_idx,
                                                &color->color_range));
    } else if (field_name == "color_primaries") {
      if (!value.IntegerValueInRange(/*min=*/0, /*max=*/255, *line_idx,
                                     &color->color_primaries)) {
        return false;
      }
    } else if (field_name == "transfer_characteristics") {
      RETURN_IF_FALSE(value.IntegerValueInRange(
          /*min=*/0, /*max=*/255, *line_idx, &color->transfer_characteristics));
    } else if (field_name == "matrix_coefficients") {
      RETURN_IF_FALSE(value.IntegerValueInRange(
          /*min=*/0, /*max=*/255, *line_idx, &color->matrix_coefficients));
    } else {
      fprintf(stderr, "Error: Unknown field '%s' at line %d\n",
              field_name.c_str(), *line_idx);
      return false;
    }
  }
  if (syntax_error) return false;
  return true;
}